

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool *pbVar6;
  col_type *v;
  element_type *peVar7;
  float *pfVar8;
  long in_RDI;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar9;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar10;
  undefined8 extraout_XMM1_Qb_00;
  vec4 vVar11;
  TransformationGizmo *in_stack_00000130;
  mat4 Pinv;
  mat4 P;
  vec3 sphereColor;
  vec3 selectTrans;
  vec3 selectRot;
  mat4 projMat;
  mat4 viewMat;
  float gizmoSize;
  float gizmoSizePreTrans;
  float transScale;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff8f0;
  allocator *paVar12;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff940;
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [36];
  undefined8 local_4d4;
  undefined8 local_4cc;
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [8];
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffb98;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffba0;
  allocator local_449;
  string local_448 [36];
  undefined8 local_424;
  undefined8 local_41c;
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [164];
  vec<3,_float,_(glm::qualifier)0> local_344;
  vec<3,_float,_(glm::qualifier)0> local_338;
  vec<3,_float,_(glm::qualifier)0> local_328;
  allocator local_319;
  string local_318 [32];
  vec<3,_float,_(glm::qualifier)0> local_2f8;
  vec<3,_float,_(glm::qualifier)0> local_2e8;
  allocator local_2d9;
  string local_2d8 [32];
  vec<3,_float,_(glm::qualifier)0> local_2b8;
  vec<3,_float,_(glm::qualifier)0> local_2ac;
  vec<3,_float,_(glm::qualifier)0> local_2a0;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [103];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [55];
  allocator local_151;
  string local_150 [36];
  vec<3,_float,_(glm::qualifier)0> local_12c [22];
  float local_20;
  float local_1c;
  vec<3,float,(glm::qualifier)0> local_18 [12];
  float local_c;
  
  pbVar6 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x28));
  if ((*pbVar6 & 1U) != 0) {
    bVar5 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xb0));
    if (!bVar5) {
      prepare(in_stack_00000130);
    }
    v = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                  (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),0);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>(local_18,v);
    local_c = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x382cef);
    local_1c = (float)((double)*(float *)(in_RDI + 0x60) * polyscope::state::lengthScale);
    local_20 = local_c * local_1c;
    view::getCameraViewMatrix();
    glm::operator*(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(local_12c,local_1c,local_1c,local_1c);
    glm::scale<float,(glm::qualifier)0>(in_stack_fffffffffffff940);
    glm::operator*(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x382df6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"u_modelView",&local_151);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x382e3e);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_150,pfVar8);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x382e99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"u_modelView",&local_189);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x382ee1);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_188,pfVar8);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x382f3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"u_modelView",&local_1b1);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x382f84);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_1b0,pfVar8);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    view::getCameraPerspectiveMatrix();
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x382fec);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"u_projMatrix",&local_219);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x383034);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_218,pfVar8);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38308f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"u_projMatrix",&local_241);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x3830d7);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_240,pfVar8);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383132);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"u_projMatrix",&local_269);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x38317a);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_268,pfVar8);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3831d5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"u_diskWidthRel",&local_291);
    (*peVar7->_vptr_ShaderProgram[5])((ulong)*(uint *)(in_RDI + 100),peVar7,local_290);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_2a0,0.0,0.0,0.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_2ac,0.0,0.0,0.0);
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_2b8,0.85);
    if (*(int *)(in_RDI + 0x74) == 1) {
      pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         (&local_2a0,*(length_type *)(in_RDI + 0x70));
      *pfVar8 = 1.0;
    }
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3834e7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"u_active",&local_2d9);
    local_2e8.field_2 = local_2a0.field_2;
    local_2e8.field_0 = local_2a0.field_0;
    local_2e8.field_1 = local_2a0.field_1;
    local_2f8.field_2 = local_2a0.field_2;
    local_2f8.field_0 = local_2a0.field_0;
    local_2f8.field_1 = local_2a0.field_1;
    (*peVar7->_vptr_ShaderProgram[9])
              (local_2a0._0_8_,(ulong)(uint)local_2a0.field_2,peVar7,local_2d8);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    if (*(int *)(in_RDI + 0x74) == 2) {
      pfVar8 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         (&local_2ac,*(length_type *)(in_RDI + 0x70));
      *pfVar8 = 1.0;
    }
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383636);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,"u_active",&local_319);
    local_328.field_2 = local_2ac.field_2;
    local_328.field_0 = local_2ac.field_0;
    local_328.field_1 = local_2ac.field_1;
    local_338.field_2 = local_2ac.field_2;
    local_338.field_0 = local_2ac.field_0;
    local_338.field_1 = local_2ac.field_1;
    (*peVar7->_vptr_ShaderProgram[9])
              (local_2ac._0_8_,(ulong)(uint)local_2ac.field_2,peVar7,local_318);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    if (*(int *)(in_RDI + 0x74) == 3) {
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_344,0.95);
      local_2b8.field_0 = local_344.field_0;
      local_2b8.field_1 = local_344.field_1;
      local_2b8.field_2 = local_344.field_2;
    }
    view::getCameraPerspectiveMatrix();
    glm::inverse<4,4,float,(glm::qualifier)0>(in_stack_fffffffffffff8f0);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3837be);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"u_invProjMatrix",&local_3e9);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x383806);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_3e8,pfVar8);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383861);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_410,"u_viewport",&local_411);
    uVar9 = extraout_XMM0_Qb;
    uVar10 = extraout_XMM1_Qb;
    vVar11 = render::Engine::getCurrentViewport(render::engine);
    auVar3._8_8_ = uVar10;
    auVar3._0_8_ = vVar11._8_8_;
    auVar4._8_8_ = uVar9;
    auVar4._0_8_ = vVar11._0_8_;
    local_424 = vmovlpd_avx(auVar4);
    local_41c = vmovlpd_avx(auVar3);
    (*peVar7->_vptr_ShaderProgram[10])(local_424,local_41c,peVar7,local_410);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38393e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"u_lengthMult",&local_449);
    (*peVar7->_vptr_ShaderProgram[5])((ulong)*(uint *)(in_RDI + 0x68),peVar7,local_448);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3839cf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"u_radius",&local_471);
    (*peVar7->_vptr_ShaderProgram[6])((double)local_20 * 0.2,peVar7,local_470);
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383a60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_498,"u_invProjMatrix",&local_499);
    pfVar8 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x383a9f);
    (*peVar7->_vptr_ShaderProgram[7])(peVar7,local_498,pfVar8);
    std::__cxx11::string::~string(local_498);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383af1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,"u_viewport",&local_4c1);
    uVar9 = extraout_XMM0_Qb_00;
    uVar10 = extraout_XMM1_Qb_00;
    vVar11 = render::Engine::getCurrentViewport(render::engine);
    auVar1._8_8_ = uVar10;
    auVar1._0_8_ = vVar11._8_8_;
    auVar2._8_8_ = uVar9;
    auVar2._0_8_ = vVar11._0_8_;
    local_4d4 = vmovlpd_avx(auVar2);
    local_4cc = vmovlpd_avx(auVar1);
    (*peVar7->_vptr_ShaderProgram[10])(local_4d4,local_4cc,peVar7,local_4c0);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383bb6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"u_pointRadius",&local_4f9);
    (*peVar7->_vptr_ShaderProgram[5])
              ((ulong)(uint)(*(float *)(in_RDI + 0x6c) * local_20),peVar7,local_4f8);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383c48);
    paVar12 = &local_521;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"u_baseColor",paVar12);
    (*peVar7->_vptr_ShaderProgram[9])
              (local_2b8._0_8_,(ulong)(uint)local_2b8.field_2,peVar7,local_520);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383d42);
    (*peVar7->_vptr_ShaderProgram[0x1e])();
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383d62);
    (*peVar7->_vptr_ShaderProgram[0x1e])();
    peVar7 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x383d82);
    (*peVar7->_vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode();
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}